

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedResult.cpp
# Opt level: O3

void __thiscall
oout::TimedResult::TimedResult
          (TimedResult *this,shared_ptr<const_oout::Result> *result,nanoseconds *duration)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__TimedResult_001209e8;
  (this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->duration).__r = duration->__r;
  return;
}

Assistant:

TimedResult::TimedResult(
	const shared_ptr<const Result> &result,
	const chrono::nanoseconds &duration
) : result(result), duration(duration)
{
}